

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void __thiscall duckdb::UpdateSegment::RollbackUpdate(UpdateSegment *this,UpdateInfo *info)

{
  rollback_update_function_t p_Var1;
  UpdateInfo *pUVar2;
  StorageLockKey *pSVar3;
  UpdateInfo *lock;
  UpdateSegment *this_00;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> lock_handle;
  UndoBufferPointer entry;
  UndoBufferReference pin;
  undefined1 auStack_58 [32];
  BufferHandle local_38;
  
  this_00 = (UpdateSegment *)auStack_58;
  pSVar3 = (StorageLockKey *)&this->lock;
  StorageLock::GetExclusiveLock((StorageLock *)auStack_58);
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::operator*
            ((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
              *)auStack_58);
  auStack_58._8_16_ = (undefined1  [16])GetUpdateNode(this,pSVar3,info->vector_index);
  if (auStack_58._8_8_ != (UndoBufferEntry *)0x0) {
    UndoBufferPointer::Pin
              ((UndoBufferReference *)(auStack_58 + 0x18),(UndoBufferPointer *)(auStack_58 + 8));
    p_Var1 = this->rollback_update_function;
    pUVar2 = (UpdateInfo *)UndoBufferReference::Ptr((UndoBufferReference *)(auStack_58 + 0x18));
    lock = info;
    (*p_Var1)(pUVar2,info);
    unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::operator*
              ((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
                *)auStack_58);
    CleanupUpdateInternal(this_00,(StorageLockKey *)lock,info);
    BufferHandle::~BufferHandle(&local_38);
  }
  ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  ~unique_ptr((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
              auStack_58);
  return;
}

Assistant:

void UpdateSegment::RollbackUpdate(UpdateInfo &info) {
	// obtain an exclusive lock
	auto lock_handle = lock.GetExclusiveLock();

	// move the data from the UpdateInfo back into the base info
	auto entry = GetUpdateNode(*lock_handle, info.vector_index);
	if (!entry.IsSet()) {
		return;
	}
	auto pin = entry.Pin();
	rollback_update_function(UpdateInfo::Get(pin), info);

	// clean up the update chain
	CleanupUpdateInternal(*lock_handle, info);
}